

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O3

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v)

{
  size_t sVar1;
  size_t *psVar2;
  unsigned_long __tmp_1;
  unsigned_long __tmp;
  
  sVar1 = v->m_label;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar2 = (size_t *)operator_new(8);
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = psVar2;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = psVar2 + 1;
  *psVar2 = sVar1;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar2 + 1;
  sVar1 = v->m_states;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (size_t *)operator_new(8);
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = psVar2;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = psVar2 + 1;
  *psVar2 = sVar1;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar2 + 1;
  this->m_d = psVar2;
  return;
}

Assistant:

variable_set(const variable& v) :
			m_v(1, v.label()), m_dlocal(1, v.states()) {
		m_d = &m_dlocal[0];
	}